

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  pointer ppGVar3;
  pointer ppEVar4;
  ElemSegment *pEVar5;
  pointer pEVar6;
  pointer ppDVar7;
  DataSegment *pDVar8;
  pointer ppVVar9;
  ulong uVar10;
  pointer ppFVar11;
  pointer ppEVar12;
  pointer ppGVar13;
  pointer ppEVar14;
  pointer ppEVar15;
  pointer ppDVar16;
  ElemExpr *elem_expr;
  pointer pEVar17;
  pointer ppVVar18;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ExprVisitor *local_40;
  pointer local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->elem_segment_bindings,"elem");
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->type_bindings,"type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->event_bindings,"event");
  ppFVar11 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar11 != ppFVar1) {
    do {
      func = *ppFVar11;
      this->current_func_ = func;
      if ((func->decl).has_func_type == true) {
        ResolveVar(this,&this->current_module_->type_bindings,&(func->decl).type_var,"type");
      }
      pcStack_50 = std::
                   _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/resolve-names.cc:423:7)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/resolve-names.cc:423:7)>
                 ::_M_manager;
      local_68._M_unused._0_8_ = (undefined8)func;
      local_68._8_8_ = this;
      BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      ExprVisitor::VisitFunc(&this->visitor_,func);
      this->current_func_ = (Func *)0x0;
      ppFVar11 = ppFVar11 + 1;
    } while (ppFVar11 != ppFVar1);
  }
  ppEVar2 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar12 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar12 != ppEVar2; ppEVar12 = ppEVar12 + 1) {
    uVar10 = (ulong)(*ppEVar12)->kind;
    if (uVar10 < 5) {
      ResolveVar(this,(BindingHash *)
                      ((long)&(this->current_module_->loc).filename.data_ +
                      *(long *)(&DAT_001af970 + uVar10 * 8)),&(*ppEVar12)->var,
                 &DAT_001af998 + *(int *)(&DAT_001af998 + uVar10 * 4));
    }
  }
  ppGVar13 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar3 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar13 != ppGVar3) {
    do {
      ExprVisitor::VisitExprList(&this->visitor_,&(*ppGVar13)->init_expr);
      ppGVar13 = ppGVar13 + 1;
    } while (ppGVar13 != ppGVar3);
  }
  ppEVar4 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar14 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppEVar14 != ppEVar4;
      ppEVar14 = ppEVar14 + 1) {
    if (((*ppEVar14)->decl).has_func_type == true) {
      ResolveVar(this,&this->current_module_->type_bindings,&((*ppEVar14)->decl).type_var,"type");
    }
  }
  ppEVar15 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppEVar15 != local_38) {
    local_40 = &this->visitor_;
    do {
      pEVar5 = *ppEVar15;
      ResolveVar(this,&this->current_module_->table_bindings,&pEVar5->table_var,"table");
      ExprVisitor::VisitExprList(local_40,&pEVar5->offset);
      pEVar6 = (pEVar5->elem_exprs).
               super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pEVar17 = (pEVar5->elem_exprs).
                     super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                     super__Vector_impl_data._M_start; pEVar17 != pEVar6; pEVar17 = pEVar17 + 1) {
        if (pEVar17->kind == RefFunc) {
          ResolveVar(this,&this->current_module_->func_bindings,&pEVar17->var,"function");
        }
      }
      ppEVar15 = ppEVar15 + 1;
    } while (ppEVar15 != local_38);
  }
  ppDVar16 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar7 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar16 != ppDVar7) {
    do {
      pDVar8 = *ppDVar16;
      ResolveVar(this,&this->current_module_->memory_bindings,&pDVar8->memory_var,"memory");
      ExprVisitor::VisitExprList(&this->visitor_,&pDVar8->offset);
      ppDVar16 = ppDVar16 + 1;
    } while (ppDVar16 != ppDVar7);
  }
  ppVVar9 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar18 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar18 != ppVVar9;
      ppVVar18 = ppVVar18 + 1) {
    ResolveVar(this,&this->current_module_->func_bindings,*ppVVar18,"function");
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->elem_segment_bindings, "elem");
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->type_bindings, "type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->event_bindings, "event");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (Event* event : module->events)
    VisitEvent(event);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}